

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void __thiscall google::protobuf::internal::Mutex::Lock(Mutex *this)

{
  int __errnum;
  LogMessage LStack_48;
  
  __errnum = pthread_mutex_lock((pthread_mutex_t *)this->mInternal);
  if (__errnum != 0) {
    LogMessage::LogMessage
              (&LStack_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/common.cc"
               ,0x179);
    std::__cxx11::string::append((char *)&LStack_48.message_);
    strerror(__errnum);
    std::__cxx11::string::append((char *)&LStack_48.message_);
    LogMessage::Finish(&LStack_48);
    LogMessage::~LogMessage(&LStack_48);
  }
  return;
}

Assistant:

void Mutex::Lock() {
  int result = pthread_mutex_lock(&mInternal->mutex);
  if (result != 0) {
    GOOGLE_LOG(FATAL) << "pthread_mutex_lock: " << strerror(result);
  }
}